

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O1

bool __thiscall slang::ast::ASTContext::requireTimingAllowed(ASTContext *this,SourceRange range)

{
  Symbol *pSVar1;
  Symbol *pSVar2;
  
  if (((this->flags).m_bits & 0x1800) == 0) {
    pSVar1 = this->instanceOrProc;
    pSVar2 = (Symbol *)0x0;
    if ((pSVar1 != (Symbol *)0x0) && (pSVar1->kind == ProceduralBlock)) {
      pSVar2 = pSVar1;
    }
    if (pSVar2 == (Symbol *)0x0) {
      return true;
    }
    if (1 < pSVar2[1].kind - CompilationUnit) {
      return true;
    }
  }
  addDiag(this,(DiagCode)0x4d0008,range);
  return false;
}

Assistant:

bool ASTContext::requireTimingAllowed(SourceRange range) const {
    if (flags.has(ASTFlags::Function | ASTFlags::Final) || inAlwaysCombLatch()) {
        addDiag(diag::TimingInFuncNotAllowed, range);
        return false;
    }
    return true;
}